

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv_test.cc
# Opt level: O0

void __thiscall leveldb::MemEnvTest_Basics_Test::TestBody(MemEnvTest_Basics_Test *this)

{
  Env *pEVar1;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  reference rhs;
  char *in_R9;
  AssertHelper local_cd8;
  Message local_cd0;
  allocator local_cc1;
  string local_cc0 [32];
  Status local_ca0;
  char local_c91;
  undefined1 local_c90 [8];
  AssertionResult gtest_ar_25;
  Message local_c78;
  size_type local_c70;
  int local_c64;
  undefined1 local_c60 [8];
  AssertionResult gtest_ar_24;
  Message local_c48;
  allocator local_c39;
  string local_c38 [32];
  Status local_c18;
  char local_c09;
  undefined1 local_c08 [8];
  AssertionResult gtest_ar_23;
  AssertHelper local_bd8;
  Message local_bd0;
  allocator local_bc1;
  string local_bc0 [39];
  bool local_b99;
  undefined1 local_b98 [8];
  AssertionResult gtest_ar__11;
  Message local_b80;
  allocator local_b71;
  string local_b70 [32];
  Status local_b50;
  char local_b41;
  undefined1 local_b40 [8];
  AssertionResult gtest_ar_22;
  AssertHelper local_b10;
  Message local_b08;
  allocator local_af9;
  string local_af8 [32];
  Status local_ad8;
  bool local_ac9;
  undefined1 local_ac8 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_a98;
  Message local_a90;
  bool local_a81;
  undefined1 local_a80 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_a50;
  Message local_a48;
  allocator local_a39;
  string local_a38 [32];
  Status local_a18;
  bool local_a09;
  undefined1 local_a08 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_9d8;
  Message local_9d0;
  bool local_9c1;
  undefined1 local_9c0 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_990;
  Message local_988;
  allocator local_979;
  string local_978 [32];
  Status local_958;
  bool local_949;
  undefined1 local_948 [8];
  AssertionResult gtest_ar__6;
  RandomAccessFile *rand_file;
  SequentialFile *seq_file;
  Message local_920;
  int local_914;
  undefined1 local_910 [8];
  AssertionResult gtest_ar_21;
  Message local_8f8;
  allocator local_8e9;
  string local_8e8 [32];
  Status local_8c8;
  char local_8b9;
  undefined1 local_8b8 [8];
  AssertionResult gtest_ar_20;
  AssertHelper local_888;
  Message local_880;
  allocator local_871;
  string local_870 [39];
  bool local_849;
  undefined1 local_848 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_818;
  Message local_810;
  allocator local_801;
  string local_800 [39];
  bool local_7d9;
  undefined1 local_7d8 [8];
  AssertionResult gtest_ar__4;
  Message local_7c0;
  allocator local_7b1;
  string local_7b0 [39];
  allocator local_789;
  string local_788 [32];
  Status local_768;
  char local_759;
  undefined1 local_758 [8];
  AssertionResult gtest_ar_19;
  AssertHelper local_728;
  Message local_720;
  allocator local_711;
  string local_710 [39];
  allocator local_6e9;
  string local_6e8 [32];
  Status local_6c8;
  bool local_6b9;
  undefined1 local_6b8 [8];
  AssertionResult gtest_ar__3;
  Message local_6a0;
  int local_694;
  undefined1 local_690 [8];
  AssertionResult gtest_ar_18;
  Message local_678;
  allocator local_669;
  string local_668 [32];
  Status local_648;
  char local_639;
  undefined1 local_638 [8];
  AssertionResult gtest_ar_17;
  Message local_620;
  Slice local_618;
  Status local_608;
  char local_5f9;
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar_16;
  Message local_5e0;
  int local_5d4;
  undefined1 local_5d0 [8];
  AssertionResult gtest_ar_15;
  Message local_5b8;
  allocator local_5a9;
  string local_5a8 [32];
  Status local_588;
  char local_579;
  undefined1 local_578 [8];
  AssertionResult gtest_ar_14;
  Message local_560;
  allocator local_551;
  string local_550 [32];
  Status local_530;
  char local_521;
  undefined1 local_520 [8];
  AssertionResult gtest_ar_13;
  Message local_508;
  Slice local_500;
  Status local_4f0;
  char local_4e1;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar_12;
  Message local_4c8;
  allocator local_4b9;
  string local_4b8 [32];
  Status local_498;
  char local_489;
  undefined1 local_488 [8];
  AssertionResult gtest_ar_11;
  Message local_470;
  undefined1 local_468 [8];
  AssertionResult gtest_ar_10;
  Message local_450;
  size_type local_448;
  int local_43c;
  undefined1 local_438 [8];
  AssertionResult gtest_ar_9;
  Message local_420;
  allocator local_411;
  string local_410 [32];
  Status local_3f0;
  char local_3e1;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar_8;
  Message local_3c8;
  int local_3bc;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar_7;
  Message local_3a0;
  allocator local_391;
  string local_390 [32];
  Status local_370;
  char local_361;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_330;
  Message local_328;
  allocator local_319;
  string local_318 [39];
  bool local_2f1;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar__2;
  Message local_2d8;
  int local_2cc;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_5;
  Message local_2b0;
  allocator local_2a1;
  string local_2a0 [32];
  Status local_280;
  char local_271;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_4;
  Message local_258;
  allocator local_249;
  string local_248 [32];
  Status local_228;
  char local_219;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_3;
  Message local_200;
  size_type local_1f8;
  int local_1ec;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_2;
  Message local_1d0;
  allocator local_1c1;
  string local_1c0 [32];
  Status local_1a0;
  char local_191;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_160;
  Message local_158;
  allocator local_149;
  string local_148 [32];
  Status local_128;
  bool local_119;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_e8;
  Message local_e0;
  allocator local_d1;
  string local_d0 [39];
  bool local_a9;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_;
  AssertHelper local_90;
  Message local_88;
  allocator local_79;
  string local_78 [32];
  Status local_58;
  char local_49;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  children;
  WritableFile *writable_file;
  uint64_t file_size;
  MemEnvTest_Basics_Test *this_local;
  
  file_size = (uint64_t)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&gtest_ar.message_);
  test::IsOK();
  testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
  pEVar1 = (this->super_MemEnvTest).env_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"/dir",&local_79);
  (*pEVar1->_vptr_Env[10])(&local_58,pEVar1,local_78);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_48,&local_49,
             (Status *)"env_->CreateDir(\"/dir\")");
  Status::~Status(&local_58);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar3) {
    testing::Message::Message(&local_88);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
               ,0x1f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message(&local_88);
  }
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar3;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    pEVar1 = (this->super_MemEnvTest).env_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"/dir/non_existent",&local_d1);
    iVar4 = (*pEVar1->_vptr_Env[6])(pEVar1,local_d0);
    local_a9 = (bool)(((byte)iVar4 ^ 0xff) & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_a8,&local_a9,(type *)0x0);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
    if (!bVar3) {
      testing::Message::Message(&local_e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__1.message_,(internal *)local_a8,
                 (AssertionResult *)"!env_->FileExists(\"/dir/non_existent\")","false","true",in_R9)
      ;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                 ,0x22,pcVar5);
      testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_e8);
      std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_e0);
    }
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar3;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
    if (gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      pEVar1 = (this->super_MemEnvTest).env_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_148,"/dir/non_existent",&local_149);
      (*pEVar1->_vptr_Env[0xd])(&local_128,pEVar1,local_148,&writable_file);
      bVar3 = Status::ok(&local_128);
      local_119 = (bool)((bVar3 ^ 0xffU) & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_118,&local_119,(type *)0x0);
      Status::~Status(&local_128);
      std::__cxx11::string::~string(local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
      if (!bVar3) {
        testing::Message::Message(&local_158);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_1.message_,(internal *)local_118,
                   (AssertionResult *)"!env_->GetFileSize(\"/dir/non_existent\", &file_size).ok()",
                   "false","true",in_R9);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_160,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                   ,0x23,pcVar5);
        testing::internal::AssertHelper::operator=(&local_160,&local_158);
        testing::internal::AssertHelper::~AssertHelper(&local_160);
        std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_158);
      }
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar3;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
      if (gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        test::IsOK();
        testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
        pEVar1 = (this->super_MemEnvTest).env_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1c0,"/dir",&local_1c1);
        (*pEVar1->_vptr_Env[7])(&local_1a0,pEVar1,local_1c0,&gtest_ar.message_);
        testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                  ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_190,&local_191
                   ,(Status *)"env_->GetChildren(\"/dir\", &children)");
        Status::~Status(&local_1a0);
        std::__cxx11::string::~string(local_1c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
        bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
        if (!bVar3) {
          testing::Message::Message(&local_1d0);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                     ,0x24,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_2.message_,&local_1d0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
          testing::Message::~Message(&local_1d0);
        }
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar3;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
        if (gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          local_1ec = 0;
          local_1f8 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&gtest_ar.message_);
          testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                    ((EqHelper *)local_1e8,"0","children.size()",&local_1ec,&local_1f8);
          bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
          if (!bVar3) {
            testing::Message::Message(&local_200);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                       ,0x25,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_3.message_,&local_200);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
            testing::Message::~Message(&local_200);
          }
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar3;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
          if (gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            test::IsOK();
            testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
            pEVar1 = (this->super_MemEnvTest).env_;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_248,"/dir/f",&local_249);
            (*pEVar1->_vptr_Env[4])
                      (&local_228,pEVar1,local_248,
                       &children.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                      ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_218,
                       &local_219,(Status *)"env_->NewWritableFile(\"/dir/f\", &writable_file)");
            Status::~Status(&local_228);
            std::__cxx11::string::~string(local_248);
            std::allocator<char>::~allocator((allocator<char> *)&local_249);
            bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
            if (!bVar3) {
              testing::Message::Message(&local_258);
              pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                         ,0x28,pcVar5);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_4.message_,&local_258);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
              testing::Message::~Message(&local_258);
            }
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar3;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
            if (gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              test::IsOK();
              testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
              pEVar1 = (this->super_MemEnvTest).env_;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_2a0,"/dir/f",&local_2a1);
              (*pEVar1->_vptr_Env[0xd])(&local_280,pEVar1,local_2a0,&writable_file);
              testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::
              operator()((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_270,
                         &local_271,(Status *)"env_->GetFileSize(\"/dir/f\", &file_size)");
              Status::~Status(&local_280);
              std::__cxx11::string::~string(local_2a0);
              std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
              bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
              if (!bVar3) {
                testing::Message::Message(&local_2b0);
                pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                           ,0x29,pcVar5);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_5.message_,&local_2b0);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_)
                ;
                testing::Message::~Message(&local_2b0);
              }
              gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar3;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
              if (gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                local_2cc = 0;
                testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                          ((EqHelper *)local_2c8,"0","file_size",&local_2cc,
                           (unsigned_long *)&writable_file);
                bVar3 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_2c8);
                if (!bVar3) {
                  testing::Message::Message(&local_2d8);
                  pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar__2.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                             ,0x2a,pcVar5);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar__2.message_,&local_2d8);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar__2.message_);
                  testing::Message::~Message(&local_2d8);
                }
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar3;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
                if (gtest_ar_.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  if (children.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                    (**(code **)(*(long *)children.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 8))()
                    ;
                  }
                  pEVar1 = (this->super_MemEnvTest).env_;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_318,"/dir/f",&local_319);
                  iVar4 = (*pEVar1->_vptr_Env[6])(pEVar1,local_318);
                  local_2f1 = (bool)((byte)iVar4 & 1);
                  testing::AssertionResult::AssertionResult<bool>
                            ((AssertionResult *)local_2f0,&local_2f1,(type *)0x0);
                  std::__cxx11::string::~string(local_318);
                  std::allocator<char>::~allocator((allocator<char> *)&local_319);
                  bVar3 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_2f0);
                  if (!bVar3) {
                    testing::Message::Message(&local_328);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar_6.message_,(internal *)local_2f0,
                               (AssertionResult *)0x1a82eb,"false","true",in_R9);
                    pcVar5 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_330,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                               ,0x2e,pcVar5);
                    testing::internal::AssertHelper::operator=(&local_330,&local_328);
                    testing::internal::AssertHelper::~AssertHelper(&local_330);
                    std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
                    testing::Message::~Message(&local_328);
                  }
                  gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._5_3_ = 0;
                  gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_1_ = !bVar3;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
                  if (gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ == 0) {
                    test::IsOK();
                    testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                              ();
                    pEVar1 = (this->super_MemEnvTest).env_;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_390,"/dir/f",&local_391);
                    (*pEVar1->_vptr_Env[0xd])(&local_370,pEVar1,local_390,&writable_file);
                    testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::
                    operator()((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)
                               local_360,&local_361,
                               (Status *)"env_->GetFileSize(\"/dir/f\", &file_size)");
                    Status::~Status(&local_370);
                    std::__cxx11::string::~string(local_390);
                    std::allocator<char>::~allocator((allocator<char> *)&local_391);
                    bVar3 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_360);
                    if (!bVar3) {
                      testing::Message::Message(&local_3a0);
                      pcVar5 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_360);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                                 ,0x2f,pcVar5);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_7.message_,&local_3a0);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_7.message_);
                      testing::Message::~Message(&local_3a0);
                    }
                    gtest_ar_.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._5_3_ = 0;
                    gtest_ar_.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_1_ = !bVar3;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
                    if (gtest_ar_.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_ == 0) {
                      local_3bc = 0;
                      testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                                ((EqHelper *)local_3b8,"0","file_size",&local_3bc,
                                 (unsigned_long *)&writable_file);
                      bVar3 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_3b8);
                      if (!bVar3) {
                        testing::Message::Message(&local_3c8);
                        pcVar5 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_3b8);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_8.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                                   ,0x30,pcVar5);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_8.message_,&local_3c8);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar_8.message_);
                        testing::Message::~Message(&local_3c8);
                      }
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._5_3_ = 0;
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_1_ = !bVar3;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
                      if (gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_ == 0) {
                        test::IsOK();
                        testing::internal::
                        MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
                        pEVar1 = (this->super_MemEnvTest).env_;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_410,"/dir",&local_411);
                        (*pEVar1->_vptr_Env[7])(&local_3f0,pEVar1,local_410,&gtest_ar.message_);
                        testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                        ::operator()((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)
                                     local_3e0,&local_3e1,
                                     (Status *)"env_->GetChildren(\"/dir\", &children)");
                        Status::~Status(&local_3f0);
                        std::__cxx11::string::~string(local_410);
                        std::allocator<char>::~allocator((allocator<char> *)&local_411);
                        bVar3 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_3e0);
                        if (!bVar3) {
                          testing::Message::Message(&local_420);
                          pcVar5 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_3e0);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_9.message_,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                                     ,0x31,pcVar5);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_9.message_,&local_420);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar_9.message_);
                          testing::Message::~Message(&local_420);
                        }
                        gtest_ar_.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._5_3_ = 0;
                        gtest_ar_.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_1_ = !bVar3;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
                        if (gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_ == 0) {
                          local_43c = 1;
                          local_448 = std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)&gtest_ar.message_);
                          testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                                    ((EqHelper *)local_438,"1","children.size()",&local_43c,
                                     &local_448);
                          bVar3 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_438);
                          if (!bVar3) {
                            testing::Message::Message(&local_450);
                            pcVar5 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_438);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_10.message_,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                                       ,0x32,pcVar5);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_10.message_,&local_450);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_10.message_);
                            testing::Message::~Message(&local_450);
                          }
                          gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._5_3_ = 0;
                          gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_1_ = !bVar3;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
                          if (gtest_ar_.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_ == 0) {
                            rhs = std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)&gtest_ar.message_,0);
                            testing::internal::EqHelper::
                            Compare<char[2],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                      ((EqHelper *)local_468,"\"f\"","children[0]",
                                       (char (*) [2])0x1a81ca,rhs);
                            bVar3 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_468);
                            if (!bVar3) {
                              testing::Message::Message(&local_470);
                              pcVar5 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_468);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar_11.message_,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                                         ,0x33,pcVar5);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar_11.message_,&local_470);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&gtest_ar_11.message_);
                              testing::Message::~Message(&local_470);
                            }
                            gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._5_3_ = 0;
                            gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_1_ = !bVar3;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_468)
                            ;
                            if (gtest_ar_.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_ == 0) {
                              test::IsOK();
                              testing::internal::
                              MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
                              pEVar1 = (this->super_MemEnvTest).env_;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string(local_4b8,"/dir/f",&local_4b9);
                              (*pEVar1->_vptr_Env[4])
                                        (&local_498,pEVar1,local_4b8,
                                         &children.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                              testing::internal::
                              PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                                        ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                          *)local_488,&local_489,
                                         (Status *)
                                         "env_->NewWritableFile(\"/dir/f\", &writable_file)");
                              Status::~Status(&local_498);
                              std::__cxx11::string::~string(local_4b8);
                              std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
                              bVar3 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_488);
                              if (!bVar3) {
                                testing::Message::Message(&local_4c8);
                                pcVar5 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_488);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_12.message_,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                                           ,0x36,pcVar5);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_12.message_,&local_4c8);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_12.message_);
                                testing::Message::~Message(&local_4c8);
                              }
                              gtest_ar_.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._5_3_ = 0;
                              gtest_ar_.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_1_ = !bVar3;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_488);
                              if (gtest_ar_.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_4_ == 0) {
                                test::IsOK();
                                testing::internal::
                                MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
                                pbVar2 = children.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                Slice::Slice(&local_500,"abc");
                                (**(code **)(*(long *)pbVar2 + 0x10))(&local_4f0,pbVar2,&local_500);
                                testing::internal::
                                PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::
                                operator()((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                            *)local_4e0,&local_4e1,
                                           (Status *)"writable_file->Append(\"abc\")");
                                Status::~Status(&local_4f0);
                                bVar3 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_4e0);
                                if (!bVar3) {
                                  testing::Message::Message(&local_508);
                                  pcVar5 = testing::AssertionResult::failure_message
                                                     ((AssertionResult *)local_4e0);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_13.message_,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                                             ,0x37,pcVar5);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_13.message_,&local_508);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar_13.message_);
                                  testing::Message::~Message(&local_508);
                                }
                                gtest_ar_.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._5_3_ = 0;
                                gtest_ar_.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_1_ = !bVar3;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_4e0);
                                if (gtest_ar_.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._4_4_ == 0) {
                                  if (children.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
                                      (pointer)0x0) {
                                    (**(code **)(*(long *)children.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                + 8))();
                                  }
                                  test::IsOK();
                                  testing::internal::
                                  MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
                                  pEVar1 = (this->super_MemEnvTest).env_;
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string(local_550,"/dir/f",&local_551);
                                  (*pEVar1->_vptr_Env[5])
                                            (&local_530,pEVar1,local_550,
                                             &children.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                                  testing::internal::
                                  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::
                                  operator()((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                              *)local_520,&local_521,
                                             (Status *)
                                             "env_->NewAppendableFile(\"/dir/f\", &writable_file)");
                                  Status::~Status(&local_530);
                                  std::__cxx11::string::~string(local_550);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_551);
                                  bVar3 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_520);
                                  if (!bVar3) {
                                    testing::Message::Message(&local_560);
                                    pcVar5 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)local_520);
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&gtest_ar_14.message_,kFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                                               ,0x3b,pcVar5);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&gtest_ar_14.message_,&local_560);
                                    testing::internal::AssertHelper::~AssertHelper
                                              ((AssertHelper *)&gtest_ar_14.message_);
                                    testing::Message::~Message(&local_560);
                                  }
                                  gtest_ar_.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._5_3_ = 0;
                                  gtest_ar_.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_1_ = !bVar3;
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_520);
                                  if (gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._4_4_ == 0) {
                                    test::IsOK();
                                    testing::internal::
                                    MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
                                    pEVar1 = (this->super_MemEnvTest).env_;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string(local_5a8,"/dir/f",&local_5a9);
                                    (*pEVar1->_vptr_Env[0xd])
                                              (&local_588,pEVar1,local_5a8,&writable_file);
                                    testing::internal::
                                    PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::
                                    operator()((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                                *)local_578,&local_579,
                                               (Status *)"env_->GetFileSize(\"/dir/f\", &file_size)"
                                              );
                                    Status::~Status(&local_588);
                                    std::__cxx11::string::~string(local_5a8);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
                                    bVar3 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_578);
                                    if (!bVar3) {
                                      testing::Message::Message(&local_5b8);
                                      pcVar5 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_578);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_15.message_,kFatalFailure
                                                 ,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                                                 ,0x3c,pcVar5);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_15.message_,&local_5b8);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_15.message_);
                                      testing::Message::~Message(&local_5b8);
                                    }
                                    gtest_ar_.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._5_3_ = 0;
                                    gtest_ar_.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._4_1_ = !bVar3;
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_578);
                                    if (gtest_ar_.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl._4_4_ == 0) {
                                      local_5d4 = 3;
                                      testing::internal::EqHelper::
                                      Compare<int,_unsigned_long,_nullptr>
                                                ((EqHelper *)local_5d0,"3","file_size",&local_5d4,
                                                 (unsigned_long *)&writable_file);
                                      bVar3 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_5d0);
                                      if (!bVar3) {
                                        testing::Message::Message(&local_5e0);
                                        pcVar5 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_5d0);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&gtest_ar_16.message_,
                                                   kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                                                  ,0x3d,pcVar5);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&gtest_ar_16.message_,&local_5e0)
                                        ;
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&gtest_ar_16.message_);
                                        testing::Message::~Message(&local_5e0);
                                      }
                                      gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._5_3_ = 0;
                                      gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._4_1_ = !bVar3;
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_5d0);
                                      if (gtest_ar_.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl._4_4_ == 0) {
                                        test::IsOK();
                                        testing::internal::
                                        MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                                  ();
                                        pbVar2 = children.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                        Slice::Slice(&local_618,"hello");
                                        (**(code **)(*(long *)pbVar2 + 0x10))
                                                  (&local_608,pbVar2,&local_618);
                                        testing::internal::
                                        PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::
                                        operator()((
                                                  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                                  *)local_5f8,&local_5f9,
                                                  (Status *)"writable_file->Append(\"hello\")");
                                        Status::~Status(&local_608);
                                        bVar3 = testing::AssertionResult::operator_cast_to_bool
                                                          ((AssertionResult *)local_5f8);
                                        if (!bVar3) {
                                          testing::Message::Message(&local_620);
                                          pcVar5 = testing::AssertionResult::failure_message
                                                             ((AssertionResult *)local_5f8);
                                          testing::internal::AssertHelper::AssertHelper
                                                    ((AssertHelper *)&gtest_ar_17.message_,
                                                     kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                                                  ,0x3e,pcVar5);
                                          testing::internal::AssertHelper::operator=
                                                    ((AssertHelper *)&gtest_ar_17.message_,
                                                     &local_620);
                                          testing::internal::AssertHelper::~AssertHelper
                                                    ((AssertHelper *)&gtest_ar_17.message_);
                                          testing::Message::~Message(&local_620);
                                        }
                                        gtest_ar_.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl._5_3_ = 0;
                                        gtest_ar_.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl._4_1_ = !bVar3;
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)local_5f8);
                                        if (gtest_ar_.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl._4_4_ == 0) {
                                          if (children.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage !=
                                              (pointer)0x0) {
                                            (**(code **)(*(long *)children.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 8))();
                                          }
                                          test::IsOK();
                                          testing::internal::
                                          MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                                    ();
                                          pEVar1 = (this->super_MemEnvTest).env_;
                                          std::allocator<char>::allocator();
                                          std::__cxx11::string::string
                                                    (local_668,"/dir/f",&local_669);
                                          (*pEVar1->_vptr_Env[0xd])
                                                    (&local_648,pEVar1,local_668,&writable_file);
                                          testing::internal::
                                          PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                          ::operator()((
                                                  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                                  *)local_638,&local_639,
                                                  (Status *)
                                                  "env_->GetFileSize(\"/dir/f\", &file_size)");
                                          Status::~Status(&local_648);
                                          std::__cxx11::string::~string(local_668);
                                          std::allocator<char>::~allocator
                                                    ((allocator<char> *)&local_669);
                                          bVar3 = testing::AssertionResult::operator_cast_to_bool
                                                            ((AssertionResult *)local_638);
                                          if (!bVar3) {
                                            testing::Message::Message(&local_678);
                                            pcVar5 = testing::AssertionResult::failure_message
                                                               ((AssertionResult *)local_638);
                                            testing::internal::AssertHelper::AssertHelper
                                                      ((AssertHelper *)&gtest_ar_18.message_,
                                                       kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                                                  ,0x42,pcVar5);
                                            testing::internal::AssertHelper::operator=
                                                      ((AssertHelper *)&gtest_ar_18.message_,
                                                       &local_678);
                                            testing::internal::AssertHelper::~AssertHelper
                                                      ((AssertHelper *)&gtest_ar_18.message_);
                                            testing::Message::~Message(&local_678);
                                          }
                                          gtest_ar_.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl._5_3_ = 0;
                                          gtest_ar_.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl._4_1_ = !bVar3;
                                          testing::AssertionResult::~AssertionResult
                                                    ((AssertionResult *)local_638);
                                          if (gtest_ar_.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl._4_4_ == 0) {
                                            local_694 = 8;
                                            testing::internal::EqHelper::
                                            Compare<int,_unsigned_long,_nullptr>
                                                      ((EqHelper *)local_690,"8","file_size",
                                                       &local_694,(unsigned_long *)&writable_file);
                                            bVar3 = testing::AssertionResult::operator_cast_to_bool
                                                              ((AssertionResult *)local_690);
                                            if (!bVar3) {
                                              testing::Message::Message(&local_6a0);
                                              pcVar5 = testing::AssertionResult::failure_message
                                                                 ((AssertionResult *)local_690);
                                              testing::internal::AssertHelper::AssertHelper
                                                        ((AssertHelper *)&gtest_ar__3.message_,
                                                         kFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                                                  ,0x43,pcVar5);
                                              testing::internal::AssertHelper::operator=
                                                        ((AssertHelper *)&gtest_ar__3.message_,
                                                         &local_6a0);
                                              testing::internal::AssertHelper::~AssertHelper
                                                        ((AssertHelper *)&gtest_ar__3.message_);
                                              testing::Message::~Message(&local_6a0);
                                            }
                                            gtest_ar_.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl._5_3_ = 0;
                                            gtest_ar_.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl._4_1_ = !bVar3;
                                            testing::AssertionResult::~AssertionResult
                                                      ((AssertionResult *)local_690);
                                            if (gtest_ar_.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl._4_4_ == 0) {
                                              pEVar1 = (this->super_MemEnvTest).env_;
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string
                                                        (local_6e8,"/dir/non_existent",&local_6e9);
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string
                                                        (local_710,"/dir/g",&local_711);
                                              (*pEVar1->_vptr_Env[0xe])
                                                        (&local_6c8,pEVar1,local_6e8,local_710);
                                              bVar3 = Status::ok(&local_6c8);
                                              local_6b9 = (bool)((bVar3 ^ 0xffU) & 1);
                                              testing::AssertionResult::AssertionResult<bool>
                                                        ((AssertionResult *)local_6b8,&local_6b9,
                                                         (type *)0x0);
                                              Status::~Status(&local_6c8);
                                              std::__cxx11::string::~string(local_710);
                                              std::allocator<char>::~allocator
                                                        ((allocator<char> *)&local_711);
                                              std::__cxx11::string::~string(local_6e8);
                                              std::allocator<char>::~allocator
                                                        ((allocator<char> *)&local_6e9);
                                              bVar3 = testing::AssertionResult::
                                                      operator_cast_to_bool
                                                                ((AssertionResult *)local_6b8);
                                              if (!bVar3) {
                                                testing::Message::Message(&local_720);
                                                testing::internal::
                                                GetBoolAssertionFailureMessage_abi_cxx11_
                                                          ((string *)&gtest_ar_19.message_,
                                                           (internal *)local_6b8,
                                                           (AssertionResult *)
                                                                                                                      
                                                  "!env_->RenameFile(\"/dir/non_existent\", \"/dir/g\").ok()"
                                                  ,"false","true",in_R9);
                                                pcVar5 = (char *)std::__cxx11::string::c_str();
                                                testing::internal::AssertHelper::AssertHelper
                                                          (&local_728,kFatalFailure,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                                                  ,0x46,pcVar5);
                                                testing::internal::AssertHelper::operator=
                                                          (&local_728,&local_720);
                                                testing::internal::AssertHelper::~AssertHelper
                                                          (&local_728);
                                                std::__cxx11::string::~string
                                                          ((string *)&gtest_ar_19.message_);
                                                testing::Message::~Message(&local_720);
                                              }
                                              gtest_ar_.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl._5_3_ = 0;
                                              gtest_ar_.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl._4_1_ = !bVar3;
                                              testing::AssertionResult::~AssertionResult
                                                        ((AssertionResult *)local_6b8);
                                              if (gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                test::IsOK();
                                                testing::internal::
                                                MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                                          ();
                                                pEVar1 = (this->super_MemEnvTest).env_;
                                                std::allocator<char>::allocator();
                                                std::__cxx11::string::string
                                                          (local_788,"/dir/f",&local_789);
                                                std::allocator<char>::allocator();
                                                std::__cxx11::string::string
                                                          (local_7b0,"/dir/g",&local_7b1);
                                                (*pEVar1->_vptr_Env[0xe])
                                                          (&local_768,pEVar1,local_788,local_7b0);
                                                testing::internal::
                                                PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                                ::operator()((
                                                  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                                  *)local_758,&local_759,
                                                  (Status *)
                                                  "env_->RenameFile(\"/dir/f\", \"/dir/g\")");
                                                Status::~Status(&local_768);
                                                std::__cxx11::string::~string(local_7b0);
                                                std::allocator<char>::~allocator
                                                          ((allocator<char> *)&local_7b1);
                                                std::__cxx11::string::~string(local_788);
                                                std::allocator<char>::~allocator
                                                          ((allocator<char> *)&local_789);
                                                bVar3 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_758);
                                                if (!bVar3) {
                                                  testing::Message::Message(&local_7c0);
                                                  pcVar5 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_758);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar__4.message_,
                                                             kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                                                  ,0x47,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar__4.message_,
                                                             &local_7c0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar__4.message_);
                                                  testing::Message::~Message(&local_7c0);
                                                }
                                                gtest_ar_.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl._5_3_ = 0;
                                                gtest_ar_.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl._4_1_ = !bVar3;
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_758);
                                                if (gtest_ar_.message_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                  pEVar1 = (this->super_MemEnvTest).env_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string
                                                            (local_800,"/dir/f",&local_801);
                                                  iVar4 = (*pEVar1->_vptr_Env[6])(pEVar1,local_800);
                                                  local_7d9 = (bool)(((byte)iVar4 ^ 0xff) & 1);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_7d8,&local_7d9
                                                             ,(type *)0x0);
                                                  std::__cxx11::string::~string(local_800);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_801);
                                                  bVar3 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_7d8);
                                                  if (!bVar3) {
                                                    testing::Message::Message(&local_810);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar__5.message_,
                                                               (internal *)local_7d8,
                                                               (AssertionResult *)
                                                               "!env_->FileExists(\"/dir/f\")",
                                                               "false","true",in_R9);
                                                    pcVar5 = (char *)std::__cxx11::string::c_str();
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_818,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                                                  ,0x48,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_818,&local_810);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_818);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__5.message_);
                                                  testing::Message::~Message(&local_810);
                                                  }
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._5_3_ = 0;
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_1_ = !bVar3;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_7d8);
                                                  if (gtest_ar_.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                    pEVar1 = (this->super_MemEnvTest).env_;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_870,"/dir/g",&local_871);
                                                    iVar4 = (*pEVar1->_vptr_Env[6])
                                                                      (pEVar1,local_870);
                                                    local_849 = (bool)((byte)iVar4 & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_848,
                                                               &local_849,(type *)0x0);
                                                    std::__cxx11::string::~string(local_870);
                                                    std::allocator<char>::~allocator
                                                              ((allocator<char> *)&local_871);
                                                    bVar3 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_848)
                                                    ;
                                                    if (!bVar3) {
                                                      testing::Message::Message(&local_880);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar_20.message_,
                                                                 (internal *)local_848,
                                                                 (AssertionResult *)0x1a840a,"false"
                                                                 ,"true",in_R9);
                                                      pcVar5 = (char *)std::__cxx11::string::c_str()
                                                      ;
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_888,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                                                  ,0x49,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_888,&local_880);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_888);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_20.message_);
                                                  testing::Message::~Message(&local_880);
                                                  }
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._5_3_ = 0;
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_1_ = !bVar3;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_848);
                                                  if (gtest_ar_.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                    test::IsOK();
                                                    testing::internal::
                                                                                                        
                                                  MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                                            ();
                                                  pEVar1 = (this->super_MemEnvTest).env_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string
                                                            (local_8e8,"/dir/g",&local_8e9);
                                                  (*pEVar1->_vptr_Env[0xd])
                                                            (&local_8c8,pEVar1,local_8e8,
                                                             &writable_file);
                                                  testing::internal::
                                                  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                                  ::operator()((
                                                  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                                  *)local_8b8,&local_8b9,
                                                  (Status *)
                                                  "env_->GetFileSize(\"/dir/g\", &file_size)");
                                                  Status::~Status(&local_8c8);
                                                  std::__cxx11::string::~string(local_8e8);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_8e9);
                                                  bVar3 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_8b8);
                                                  if (!bVar3) {
                                                    testing::Message::Message(&local_8f8);
                                                    pcVar5 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_8b8);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_21.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                                                  ,0x4a,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_21.message_,
                                                             &local_8f8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_21.message_);
                                                  testing::Message::~Message(&local_8f8);
                                                  }
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._5_3_ = 0;
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_1_ = !bVar3;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_8b8);
                                                  if (gtest_ar_.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                    local_914 = 8;
                                                    testing::internal::EqHelper::
                                                    Compare<int,_unsigned_long,_nullptr>
                                                              ((EqHelper *)local_910,"8","file_size"
                                                               ,&local_914,
                                                               (unsigned_long *)&writable_file);
                                                    bVar3 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_910)
                                                    ;
                                                    if (!bVar3) {
                                                      testing::Message::Message(&local_920);
                                                      pcVar5 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_910);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)&seq_file,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                                                  ,0x4b,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&seq_file,&local_920);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&seq_file);
                                                  testing::Message::~Message(&local_920);
                                                  }
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._5_3_ = 0;
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_1_ = !bVar3;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_910);
                                                  if (gtest_ar_.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                    pEVar1 = (this->super_MemEnvTest).env_;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_978,"/dir/non_existent",
                                                               &local_979);
                                                    (*pEVar1->_vptr_Env[2])
                                                              (&local_958,pEVar1,local_978,
                                                               &rand_file);
                                                    bVar3 = Status::ok(&local_958);
                                                    local_949 = (bool)((bVar3 ^ 0xffU) & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_948,
                                                               &local_949,(type *)0x0);
                                                    Status::~Status(&local_958);
                                                    std::__cxx11::string::~string(local_978);
                                                    std::allocator<char>::~allocator
                                                              ((allocator<char> *)&local_979);
                                                    bVar3 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_948)
                                                    ;
                                                    if (!bVar3) {
                                                      testing::Message::Message(&local_988);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__7.message_,
                                                                 (internal *)local_948,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "!env_->NewSequentialFile(\"/dir/non_existent\", &seq_file).ok()"
                                                  ,"false","true",in_R9);
                                                  pcVar5 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_990,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                                                  ,0x50,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_990,&local_988);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_990);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__7.message_);
                                                  testing::Message::~Message(&local_988);
                                                  }
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._5_3_ = 0;
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_1_ = !bVar3;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_948);
                                                  if (gtest_ar_.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                    local_9c1 = (bool)((rand_file !=
                                                                        (RandomAccessFile *)0x0 ^
                                                                       0xffU) & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_9c0,
                                                               &local_9c1,(type *)0x0);
                                                    bVar3 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_9c0)
                                                    ;
                                                    if (!bVar3) {
                                                      testing::Message::Message(&local_9d0);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__8.message_,
                                                                 (internal *)local_9c0,
                                                                 (AssertionResult *)"!seq_file",
                                                                 "false","true",in_R9);
                                                      pcVar5 = (char *)std::__cxx11::string::c_str()
                                                      ;
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_9d8,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                                                  ,0x51,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_9d8,&local_9d0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_9d8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__8.message_);
                                                  testing::Message::~Message(&local_9d0);
                                                  }
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._5_3_ = 0;
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_1_ = !bVar3;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_9c0);
                                                  if (gtest_ar_.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                    pEVar1 = (this->super_MemEnvTest).env_;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_a38,"/dir/non_existent",
                                                               &local_a39);
                                                    (*pEVar1->_vptr_Env[3])
                                                              (&local_a18,pEVar1,local_a38,
                                                               &gtest_ar__6.message_);
                                                    bVar3 = Status::ok(&local_a18);
                                                    local_a09 = (bool)((bVar3 ^ 0xffU) & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_a08,
                                                               &local_a09,(type *)0x0);
                                                    Status::~Status(&local_a18);
                                                    std::__cxx11::string::~string(local_a38);
                                                    std::allocator<char>::~allocator
                                                              ((allocator<char> *)&local_a39);
                                                    bVar3 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_a08)
                                                    ;
                                                    if (!bVar3) {
                                                      testing::Message::Message(&local_a48);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__9.message_,
                                                                 (internal *)local_a08,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "!env_->NewRandomAccessFile(\"/dir/non_existent\", &rand_file).ok()"
                                                  ,"false","true",in_R9);
                                                  pcVar5 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a50,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                                                  ,0x52,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a50,&local_a48);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a50);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__9.message_);
                                                  testing::Message::~Message(&local_a48);
                                                  }
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._5_3_ = 0;
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_1_ = !bVar3;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_a08);
                                                  if (gtest_ar_.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                    local_a81 = (bool)(((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar__6.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0 ^ 0xffU) & 1);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_a80,&local_a81
                                                             ,(type *)0x0);
                                                  bVar3 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_a80);
                                                  if (!bVar3) {
                                                    testing::Message::Message(&local_a90);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar__10.message_,
                                                               (internal *)local_a80,
                                                               (AssertionResult *)"!rand_file",
                                                               "false","true",in_R9);
                                                    pcVar5 = (char *)std::__cxx11::string::c_str();
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_a98,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                                                  ,0x53,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a98,&local_a90);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a98);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__10.message_);
                                                  testing::Message::~Message(&local_a90);
                                                  }
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._5_3_ = 0;
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_1_ = !bVar3;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_a80);
                                                  if (gtest_ar_.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                    pEVar1 = (this->super_MemEnvTest).env_;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_af8,"/dir/non_existent",
                                                               &local_af9);
                                                    (*pEVar1->_vptr_Env[8])
                                                              (&local_ad8,pEVar1,local_af8);
                                                    bVar3 = Status::ok(&local_ad8);
                                                    local_ac9 = (bool)((bVar3 ^ 0xffU) & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_ac8,
                                                               &local_ac9,(type *)0x0);
                                                    Status::~Status(&local_ad8);
                                                    std::__cxx11::string::~string(local_af8);
                                                    std::allocator<char>::~allocator
                                                              ((allocator<char> *)&local_af9);
                                                    bVar3 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_ac8)
                                                    ;
                                                    if (!bVar3) {
                                                      testing::Message::Message(&local_b08);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar_22.message_,
                                                                 (internal *)local_ac8,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "!env_->RemoveFile(\"/dir/non_existent\").ok()",
                                                  "false","true",in_R9);
                                                  pcVar5 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_b10,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                                                  ,0x56,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_b10,&local_b08);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_b10);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_22.message_);
                                                  testing::Message::~Message(&local_b08);
                                                  }
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._5_3_ = 0;
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_1_ = !bVar3;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_ac8);
                                                  if (gtest_ar_.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                    test::IsOK();
                                                    testing::internal::
                                                                                                        
                                                  MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                                            ();
                                                  pEVar1 = (this->super_MemEnvTest).env_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string
                                                            (local_b70,"/dir/g",&local_b71);
                                                  (*pEVar1->_vptr_Env[8])
                                                            (&local_b50,pEVar1,local_b70);
                                                  testing::internal::
                                                  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                                  ::operator()((
                                                  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                                  *)local_b40,&local_b41,
                                                  (Status *)"env_->RemoveFile(\"/dir/g\")");
                                                  Status::~Status(&local_b50);
                                                  std::__cxx11::string::~string(local_b70);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_b71);
                                                  bVar3 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_b40);
                                                  if (!bVar3) {
                                                    testing::Message::Message(&local_b80);
                                                    pcVar5 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_b40);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               &gtest_ar__11.message_,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                                                  ,0x57,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar__11.message_,
                                                             &local_b80);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar__11.message_)
                                                  ;
                                                  testing::Message::~Message(&local_b80);
                                                  }
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._5_3_ = 0;
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_1_ = !bVar3;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_b40);
                                                  if (gtest_ar_.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                    pEVar1 = (this->super_MemEnvTest).env_;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_bc0,"/dir/g",&local_bc1);
                                                    iVar4 = (*pEVar1->_vptr_Env[6])
                                                                      (pEVar1,local_bc0);
                                                    local_b99 = (bool)(((byte)iVar4 ^ 0xff) & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_b98,
                                                               &local_b99,(type *)0x0);
                                                    std::__cxx11::string::~string(local_bc0);
                                                    std::allocator<char>::~allocator
                                                              ((allocator<char> *)&local_bc1);
                                                    bVar3 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_b98)
                                                    ;
                                                    if (!bVar3) {
                                                      testing::Message::Message(&local_bd0);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar_23.message_,
                                                                 (internal *)local_b98,
                                                                 (AssertionResult *)
                                                                 "!env_->FileExists(\"/dir/g\")",
                                                                 "false","true",in_R9);
                                                      pcVar5 = (char *)std::__cxx11::string::c_str()
                                                      ;
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_bd8,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                                                  ,0x58,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_bd8,&local_bd0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_bd8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_23.message_);
                                                  testing::Message::~Message(&local_bd0);
                                                  }
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._5_3_ = 0;
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_1_ = !bVar3;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_b98);
                                                  if (gtest_ar_.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                    test::IsOK();
                                                    testing::internal::
                                                                                                        
                                                  MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                                            ();
                                                  pEVar1 = (this->super_MemEnvTest).env_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string
                                                            (local_c38,"/dir",&local_c39);
                                                  (*pEVar1->_vptr_Env[7])
                                                            (&local_c18,pEVar1,local_c38,
                                                             &gtest_ar.message_);
                                                  testing::internal::
                                                  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                                  ::operator()((
                                                  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                                  *)local_c08,&local_c09,
                                                  (Status *)"env_->GetChildren(\"/dir\", &children)"
                                                  );
                                                  Status::~Status(&local_c18);
                                                  std::__cxx11::string::~string(local_c38);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_c39);
                                                  bVar3 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_c08);
                                                  if (!bVar3) {
                                                    testing::Message::Message(&local_c48);
                                                    pcVar5 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_c08);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_24.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                                                  ,0x59,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_24.message_,
                                                             &local_c48);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_24.message_);
                                                  testing::Message::~Message(&local_c48);
                                                  }
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._5_3_ = 0;
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_1_ = !bVar3;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_c08);
                                                  if (gtest_ar_.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                    local_c64 = 0;
                                                    local_c70 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::size((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar.message_);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_unsigned_long,_nullptr>
                                                            ((EqHelper *)local_c60,"0",
                                                             "children.size()",&local_c64,&local_c70
                                                            );
                                                  bVar3 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_c60);
                                                  if (!bVar3) {
                                                    testing::Message::Message(&local_c78);
                                                    pcVar5 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_c60);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_25.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                                                  ,0x5a,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_25.message_,
                                                             &local_c78);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_25.message_);
                                                  testing::Message::~Message(&local_c78);
                                                  }
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._5_3_ = 0;
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_1_ = !bVar3;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_c60);
                                                  if (gtest_ar_.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                    test::IsOK();
                                                    testing::internal::
                                                                                                        
                                                  MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                                            ();
                                                  pEVar1 = (this->super_MemEnvTest).env_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string
                                                            (local_cc0,"/dir",&local_cc1);
                                                  (*pEVar1->_vptr_Env[0xb])
                                                            (&local_ca0,pEVar1,local_cc0);
                                                  testing::internal::
                                                  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                                  ::operator()((
                                                  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                                  *)local_c90,&local_c91,
                                                  (Status *)"env_->RemoveDir(\"/dir\")");
                                                  Status::~Status(&local_ca0);
                                                  std::__cxx11::string::~string(local_cc0);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_cc1);
                                                  bVar3 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_c90);
                                                  if (!bVar3) {
                                                    testing::Message::Message(&local_cd0);
                                                    pcVar5 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_c90);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_cd8,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                                                  ,0x5b,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_cd8,&local_cd0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_cd8);
                                                  testing::Message::~Message(&local_cd0);
                                                  }
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._5_3_ = 0;
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_1_ = !bVar3;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_c90);
                                                  if (gtest_ar_.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                    gtest_ar_.message_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ = 0;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(MemEnvTest, Basics) {
  uint64_t file_size;
  WritableFile* writable_file;
  std::vector<std::string> children;

  ASSERT_LEVELDB_OK(env_->CreateDir("/dir"));

  // Check that the directory is empty.
  ASSERT_TRUE(!env_->FileExists("/dir/non_existent"));
  ASSERT_TRUE(!env_->GetFileSize("/dir/non_existent", &file_size).ok());
  ASSERT_LEVELDB_OK(env_->GetChildren("/dir", &children));
  ASSERT_EQ(0, children.size());

  // Create a file.
  ASSERT_LEVELDB_OK(env_->NewWritableFile("/dir/f", &writable_file));
  ASSERT_LEVELDB_OK(env_->GetFileSize("/dir/f", &file_size));
  ASSERT_EQ(0, file_size);
  delete writable_file;

  // Check that the file exists.
  ASSERT_TRUE(env_->FileExists("/dir/f"));
  ASSERT_LEVELDB_OK(env_->GetFileSize("/dir/f", &file_size));
  ASSERT_EQ(0, file_size);
  ASSERT_LEVELDB_OK(env_->GetChildren("/dir", &children));
  ASSERT_EQ(1, children.size());
  ASSERT_EQ("f", children[0]);

  // Write to the file.
  ASSERT_LEVELDB_OK(env_->NewWritableFile("/dir/f", &writable_file));
  ASSERT_LEVELDB_OK(writable_file->Append("abc"));
  delete writable_file;

  // Check that append works.
  ASSERT_LEVELDB_OK(env_->NewAppendableFile("/dir/f", &writable_file));
  ASSERT_LEVELDB_OK(env_->GetFileSize("/dir/f", &file_size));
  ASSERT_EQ(3, file_size);
  ASSERT_LEVELDB_OK(writable_file->Append("hello"));
  delete writable_file;

  // Check for expected size.
  ASSERT_LEVELDB_OK(env_->GetFileSize("/dir/f", &file_size));
  ASSERT_EQ(8, file_size);

  // Check that renaming works.
  ASSERT_TRUE(!env_->RenameFile("/dir/non_existent", "/dir/g").ok());
  ASSERT_LEVELDB_OK(env_->RenameFile("/dir/f", "/dir/g"));
  ASSERT_TRUE(!env_->FileExists("/dir/f"));
  ASSERT_TRUE(env_->FileExists("/dir/g"));
  ASSERT_LEVELDB_OK(env_->GetFileSize("/dir/g", &file_size));
  ASSERT_EQ(8, file_size);

  // Check that opening non-existent file fails.
  SequentialFile* seq_file;
  RandomAccessFile* rand_file;
  ASSERT_TRUE(!env_->NewSequentialFile("/dir/non_existent", &seq_file).ok());
  ASSERT_TRUE(!seq_file);
  ASSERT_TRUE(!env_->NewRandomAccessFile("/dir/non_existent", &rand_file).ok());
  ASSERT_TRUE(!rand_file);

  // Check that deleting works.
  ASSERT_TRUE(!env_->RemoveFile("/dir/non_existent").ok());
  ASSERT_LEVELDB_OK(env_->RemoveFile("/dir/g"));
  ASSERT_TRUE(!env_->FileExists("/dir/g"));
  ASSERT_LEVELDB_OK(env_->GetChildren("/dir", &children));
  ASSERT_EQ(0, children.size());
  ASSERT_LEVELDB_OK(env_->RemoveDir("/dir"));
}